

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeHalt(Vdbe *p)

{
  byte *pbVar1;
  i64 *piVar2;
  uint uVar3;
  sqlite3 *db;
  VdbeFrame *pVVar4;
  bool bVar5;
  int iVar6;
  VdbeFrame *pFrame;
  byte bVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  VdbeFrame *pDel;
  
  if (p->magic != 0x2df20da3) {
    return 0;
  }
  db = p->db;
  if (db->mallocFailed != '\0') {
    p->rc = 7;
  }
  pVVar4 = p->pFrame;
  if (p->pFrame != (VdbeFrame *)0x0) {
    do {
      pFrame = pVVar4;
      pVVar4 = pFrame->pParent;
    } while (pVVar4 != (VdbeFrame *)0x0);
    sqlite3VdbeFrameRestore(pFrame);
    p->pFrame = (VdbeFrame *)0x0;
    p->nFrame = 0;
  }
  closeCursorsInFrame(p);
  if (p->aMem != (Mem *)0x0) {
    releaseMemArray(p->aMem,p->nMem);
  }
  while (pVVar4 = p->pDelFrame, pVVar4 != (VdbeFrame *)0x0) {
    p->pDelFrame = pVVar4->pParent;
    if (0 < pVVar4->nChildCsr) {
      iVar9 = pVVar4->nChildMem;
      lVar10 = 0;
      do {
        sqlite3VdbeFreeCursor(pVVar4->v,(VdbeCursor *)(&pVVar4[1].v)[(long)iVar9 * 7 + lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 < pVVar4->nChildCsr);
    }
    releaseMemArray((Mem *)(pVVar4 + 1),pVVar4->nChildMem);
    sqlite3VdbeDeleteAuxData(pVVar4->v->db,&pVVar4->pAuxData,-1,0);
    sqlite3DbFreeNN(pVVar4->v->db,pVVar4);
  }
  if (p->pAuxData != (AuxData *)0x0) {
    sqlite3VdbeDeleteAuxData(p->db,&p->pAuxData,-1,0);
  }
  if ((p->pc < 0) || ((p->field_0xc2 & 1) == 0)) goto LAB_0020a101;
  sqlite3VdbeEnter(p);
  uVar3 = p->rc;
  bVar7 = (byte)uVar3;
  bVar11 = (byte)(0x2680 >> (bVar7 & 0x1f)) & bVar7 < 0xe;
  bVar5 = true;
  iVar9 = 0;
  if ((bVar11 == 1) && (iVar9 = 0, (uVar3 & 0xf) != 9 || -1 < (char)*(ushort *)&p->field_0xc1)) {
    if (((bVar7 == 0xd) || ((uVar3 & 0xff) == 7)) && ((*(ushort *)&p->field_0xc1 & 0x40) != 0)) {
      iVar9 = 2;
      bVar5 = false;
    }
    else {
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
      db->autoCommit = '\x01';
      p->nChange = 0;
    }
  }
  if ((p->rc == 0) && (0 < p->nFkConstraint)) {
    p->rc = 0x313;
    p->errorAction = '\x02';
    sqlite3VdbeError(p,"FOREIGN KEY constraint failed");
  }
  if (((db->nVTrans < 1) || (db->aVTrans != (VTable **)0x0)) &&
     ((db->autoCommit != '\0' && (db->nVdbeWrite == (uint)((p->field_0xc1 & 0x80) == 0))))) {
    if ((p->rc != 0) && (bVar11 != 0 || p->errorAction != '\x03')) {
LAB_0020a015:
      sqlite3RollbackAll(db,0);
      p->nChange = 0;
LAB_0020a038:
      db->nStatement = 0;
      goto LAB_0020a043;
    }
    lVar10 = p->db->nDeferredImmCons;
    piVar2 = &p->db->nDeferredCons;
    lVar8 = lVar10 + *piVar2;
    if (lVar8 == 0 || SCARRY8(lVar10,*piVar2) != lVar8 < 0) {
      iVar6 = vdbeCommit(db,p);
LAB_00209ff8:
      if (iVar6 == 0) {
        db->nDeferredCons = 0;
        db->nDeferredImmCons = 0;
        pbVar1 = (byte *)((long)&db->flags + 2);
        *pbVar1 = *pbVar1 & 0x7b;
        goto LAB_0020a038;
      }
      if ((iVar6 != 5) || ((p->field_0xc1 & 0x80) == 0)) {
        p->rc = iVar6;
        goto LAB_0020a015;
      }
      iVar9 = 5;
    }
    else {
      p->rc = 0x313;
      p->errorAction = '\x02';
      sqlite3VdbeError(p,"FOREIGN KEY constraint failed");
      iVar6 = 0x313;
      if ((p->field_0xc1 & 0x80) == 0) goto LAB_00209ff8;
      iVar9 = 1;
    }
    if (p->lockMask != 0) {
      vdbeLeave(p);
    }
    bVar5 = false;
  }
  else {
    if (((bVar5) && (iVar9 = 1, p->rc != 0)) && (p->errorAction != '\x03')) {
      if (p->errorAction == '\x02') {
        iVar9 = 2;
      }
      else {
        sqlite3RollbackAll(db,0x204);
        sqlite3CloseSavepoints(db);
        db->autoCommit = '\x01';
        p->nChange = 0;
        iVar9 = 0;
      }
    }
LAB_0020a043:
    if (iVar9 != 0) {
      iVar6 = 0;
      if ((p->db->nStatement != 0) && (p->iStatement != 0)) {
        iVar6 = vdbeCloseStatement(p,iVar9);
      }
      if (iVar6 != 0) {
        if (p->rc == 0 || (char)p->rc == '\x13') {
          p->rc = iVar6;
          if (p->zErrMsg != (char *)0x0) {
            sqlite3DbFreeNN(db,p->zErrMsg);
          }
          p->zErrMsg = (char *)0x0;
        }
        sqlite3RollbackAll(db,0x204);
        sqlite3CloseSavepoints(db);
        db->autoCommit = '\x01';
        p->nChange = 0;
      }
    }
    if ((p->field_0xc1 & 0x10) != 0) {
      if (iVar9 == 2) {
        db->nChange = 0;
      }
      else {
        iVar6 = p->nChange;
        db->nChange = iVar6;
        db->nTotalChange = db->nTotalChange + iVar6;
      }
      p->nChange = 0;
    }
    bVar5 = true;
    if (p->lockMask != 0) {
      vdbeLeave(p);
    }
  }
  if (!bVar5) {
    return iVar9;
  }
LAB_0020a101:
  if (-1 < p->pc) {
    db->nVdbeActive = db->nVdbeActive + -1;
    if ((p->field_0xc1 & 0x80) == 0) {
      db->nVdbeWrite = db->nVdbeWrite + -1;
    }
    if ((p->field_0xc2 & 1) != 0) {
      db->nVdbeRead = db->nVdbeRead + -1;
    }
  }
  p->magic = 0x319c2973;
  if (db->mallocFailed != '\0') {
    p->rc = 7;
  }
  return (uint)(p->rc == 5) * 5;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeHalt(Vdbe *p){
  int rc;                         /* Used to store transient return codes */
  sqlite3 *db = p->db;

  /* This function contains the logic that determines if a statement or
  ** transaction will be committed or rolled back as a result of the
  ** execution of this virtual machine. 
  **
  ** If any of the following errors occur:
  **
  **     SQLITE_NOMEM
  **     SQLITE_IOERR
  **     SQLITE_FULL
  **     SQLITE_INTERRUPT
  **
  ** Then the internal cache might have been left in an inconsistent
  ** state.  We need to rollback the statement transaction, if there is
  ** one, or the complete transaction if there is no statement transaction.
  */

  if( p->magic!=VDBE_MAGIC_RUN ){
    return SQLITE_OK;
  }
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }
  closeAllCursors(p);
  checkActiveVdbeCnt(db);

  /* No commit or rollback needed if the program never started or if the
  ** SQL statement does not read or write a database file.  */
  if( p->pc>=0 && p->bIsReader ){
    int mrc;   /* Primary error code from p->rc */
    int eStatementOp = 0;
    int isSpecialError;            /* Set to true if a 'special' error */

    /* Lock all btrees used by the statement */
    sqlite3VdbeEnter(p);

    /* Check for one of the special errors */
    mrc = p->rc & 0xff;
    isSpecialError = mrc==SQLITE_NOMEM || mrc==SQLITE_IOERR
                     || mrc==SQLITE_INTERRUPT || mrc==SQLITE_FULL;
    if( isSpecialError ){
      /* If the query was read-only and the error code is SQLITE_INTERRUPT, 
      ** no rollback is necessary. Otherwise, at least a savepoint 
      ** transaction must be rolled back to restore the database to a 
      ** consistent state.
      **
      ** Even if the statement is read-only, it is important to perform
      ** a statement or transaction rollback operation. If the error 
      ** occurred while writing to the journal, sub-journal or database
      ** file as part of an effort to free up cache space (see function
      ** pagerStress() in pager.c), the rollback is required to restore 
      ** the pager to a consistent state.
      */
      if( !p->readOnly || mrc!=SQLITE_INTERRUPT ){
        if( (mrc==SQLITE_NOMEM || mrc==SQLITE_FULL) && p->usesStmtJournal ){
          eStatementOp = SAVEPOINT_ROLLBACK;
        }else{
          /* We are forced to roll back the active transaction. Before doing
          ** so, abort any other statements this handle currently has active.
          */
          sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
          sqlite3CloseSavepoints(db);
          db->autoCommit = 1;
          p->nChange = 0;
        }
      }
    }

    /* Check for immediate foreign key violations. */
    if( p->rc==SQLITE_OK ){
      sqlite3VdbeCheckFk(p, 0);
    }
  
    /* If the auto-commit flag is set and this is the only active writer 
    ** VM, then we do either a commit or rollback of the current transaction. 
    **
    ** Note: This block also runs if one of the special errors handled 
    ** above has occurred. 
    */
    if( !sqlite3VtabInSync(db) 
     && db->autoCommit 
     && db->nVdbeWrite==(p->readOnly==0) 
    ){
      if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
        rc = sqlite3VdbeCheckFk(p, 1);
        if( rc!=SQLITE_OK ){
          if( NEVER(p->readOnly) ){
            sqlite3VdbeLeave(p);
            return SQLITE_ERROR;
          }
          rc = SQLITE_CONSTRAINT_FOREIGNKEY;
        }else{ 
          /* The auto-commit flag is true, the vdbe program was successful 
          ** or hit an 'OR FAIL' constraint and there are no deferred foreign
          ** key constraints to hold up the transaction. This means a commit 
          ** is required. */
          rc = vdbeCommit(db, p);
        }
        if( rc==SQLITE_BUSY && p->readOnly ){
          sqlite3VdbeLeave(p);
          return SQLITE_BUSY;
        }else if( rc!=SQLITE_OK ){
          p->rc = rc;
          sqlite3RollbackAll(db, SQLITE_OK);
          p->nChange = 0;
        }else{
          db->nDeferredCons = 0;
          db->nDeferredImmCons = 0;
          db->flags &= ~SQLITE_DeferFKs;
          sqlite3CommitInternalChanges(db);
        }
      }else{
        sqlite3RollbackAll(db, SQLITE_OK);
        p->nChange = 0;
      }
      db->nStatement = 0;
    }else if( eStatementOp==0 ){
      if( p->rc==SQLITE_OK || p->errorAction==OE_Fail ){
        eStatementOp = SAVEPOINT_RELEASE;
      }else if( p->errorAction==OE_Abort ){
        eStatementOp = SAVEPOINT_ROLLBACK;
      }else{
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }
  
    /* If eStatementOp is non-zero, then a statement transaction needs to
    ** be committed or rolled back. Call sqlite3VdbeCloseStatement() to
    ** do so. If this operation returns an error, and the current statement
    ** error code is SQLITE_OK or SQLITE_CONSTRAINT, then promote the
    ** current statement error code.
    */
    if( eStatementOp ){
      rc = sqlite3VdbeCloseStatement(p, eStatementOp);
      if( rc ){
        if( p->rc==SQLITE_OK || (p->rc&0xff)==SQLITE_CONSTRAINT ){
          p->rc = rc;
          sqlite3DbFree(db, p->zErrMsg);
          p->zErrMsg = 0;
        }
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }
  
    /* If this was an INSERT, UPDATE or DELETE and no statement transaction
    ** has been rolled back, update the database connection change-counter. 
    */
    if( p->changeCntOn ){
      if( eStatementOp!=SAVEPOINT_ROLLBACK ){
        sqlite3VdbeSetChanges(db, p->nChange);
      }else{
        sqlite3VdbeSetChanges(db, 0);
      }
      p->nChange = 0;
    }

    /* Release the locks */
    sqlite3VdbeLeave(p);
  }

  /* We have successfully halted and closed the VM.  Record this fact. */
  if( p->pc>=0 ){
    db->nVdbeActive--;
    if( !p->readOnly ) db->nVdbeWrite--;
    if( p->bIsReader ) db->nVdbeRead--;
    assert( db->nVdbeActive>=db->nVdbeRead );
    assert( db->nVdbeRead>=db->nVdbeWrite );
    assert( db->nVdbeWrite>=0 );
  }
  p->magic = VDBE_MAGIC_HALT;
  checkActiveVdbeCnt(db);
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }

  /* If the auto-commit flag is set to true, then any locks that were held
  ** by connection db have now been released. Call sqlite3ConnectionUnlocked() 
  ** to invoke any required unlock-notify callbacks.
  */
  if( db->autoCommit ){
    sqlite3ConnectionUnlocked(db);
  }

  assert( db->nVdbeActive>0 || db->autoCommit==0 || db->nStatement==0 );
  return (p->rc==SQLITE_BUSY ? SQLITE_BUSY : SQLITE_OK);
}